

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O0

Value * __thiscall Json::Value::find(Value *this,char *key,char *end)

{
  bool bVar1;
  reference ppVar2;
  int in_EDX;
  char *in_RSI;
  long in_RDI;
  const_iterator it;
  CZString actualKey;
  ostringstream oss;
  map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
  *in_stack_fffffffffffffdd8;
  CZString *this_00;
  string *msg;
  iterator local_1f8;
  _Rb_tree_const_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_> local_1f0;
  iterator local_1e8;
  _Rb_tree_const_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_> local_1e0;
  CZString local_1d8;
  string local_1c8 [48];
  string local_198 [12];
  Value *local_8;
  
  if (((*(ushort *)(in_RDI + 8) & 0xff) != 0) && ((*(ushort *)(in_RDI + 8) & 0xff) != 7)) {
    msg = local_198;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)msg);
    std::operator<<((ostream *)msg,
                    "in Json::Value::find(key, end, found): requires objectValue or nullValue");
    std::__cxx11::ostringstream::str();
    throwLogicError(msg);
    std::__cxx11::string::~string(local_1c8);
    abort();
  }
  if ((*(ushort *)(in_RDI + 8) & 0xff) == 0) {
    local_8 = (Value *)0x0;
  }
  else {
    this_00 = &local_1d8;
    CZString::CZString(this_00,in_RSI,in_EDX - (int)in_RSI,noDuplication);
    local_1e8._M_node =
         (_Base_ptr)
         std::
         map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
         ::find(in_stack_fffffffffffffdd8,(key_type *)0x15b48f);
    std::_Rb_tree_const_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_>::
    _Rb_tree_const_iterator(&local_1e0,&local_1e8);
    local_1f8._M_node =
         (_Base_ptr)
         std::
         map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
         ::end(in_stack_fffffffffffffdd8);
    std::_Rb_tree_const_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_>::
    _Rb_tree_const_iterator(&local_1f0,&local_1f8);
    bVar1 = std::operator==(&local_1e0,&local_1f0);
    if (bVar1) {
      local_8 = (Value *)0x0;
    }
    else {
      ppVar2 = std::_Rb_tree_const_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_>::
               operator*((_Rb_tree_const_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_>
                          *)this_00);
      local_8 = &ppVar2->second;
    }
    CZString::~CZString(this_00);
  }
  return local_8;
}

Assistant:

Value const* Value::find(char const* key, char const* end) const
{
  JSON_ASSERT_MESSAGE(
      type_ == nullValue || type_ == objectValue,
      "in Json::Value::find(key, end, found): requires objectValue or nullValue");
  if (type_ == nullValue) return NULL;
  CZString actualKey(key, static_cast<unsigned>(end-key), CZString::noDuplication);
  ObjectValues::const_iterator it = value_.map_->find(actualKey);
  if (it == value_.map_->end()) return NULL;
  return &(*it).second;
}